

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O1

void (anonymous_namespace)::
     assertValuesInOrder<slang::SmallVector<(anonymous_namespace)::Constructable,2ul>,int,int,int,int>
               (SmallVector<(anonymous_namespace)::Constructable,_2UL> *v,int *args,int *args_1,
               int *args_2,int *args_3)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  StringRef macroName;
  StringRef capturedExpression;
  array<int,_4UL> a;
  AssertionHandler catchAssertionHandler;
  int local_70 [4];
  ITransientExpression local_60;
  AssertionHandler local_50;
  
  local_70[0] = *args;
  local_70[1] = *args_1;
  local_70[2] = *args_2;
  local_70[3] = *args_3;
  local_60._vptr_ITransientExpression = (_func_int **)0xa29410;
  local_60.m_isBinaryExpression = true;
  local_60.m_result = false;
  local_60._10_6_ = 0;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x36;
  capturedExpression.m_start = "std::ranges::equal(v, a, {}, &Constructable::getValue)";
  Catch::AssertionHandler::AssertionHandler
            (&local_50,macroName,(SourceLineInfo *)&local_60,capturedExpression,ContinueOnFailure);
  if ((v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len == 4) {
    piVar2 = local_70;
    lVar3 = 0;
    do {
      iVar1 = *(int *)((long)&((v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).
                              data_)->value + lVar3);
      iVar4 = -iVar1;
      if (0 < iVar1) {
        iVar4 = iVar1;
      }
      if (iVar4 != *piVar2) goto LAB_0054957f;
      piVar2 = piVar2 + 1;
      lVar3 = lVar3 + 8;
      bVar5 = lVar3 == 0x20;
    } while (!bVar5);
  }
  else {
LAB_0054957f:
    bVar5 = false;
  }
  local_60._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00cb35e0;
  local_60._8_8_ = (ulong)CONCAT52(local_60._11_5_,CONCAT11(bVar5,bVar5)) << 8;
  Catch::AssertionHandler::handleExpr(&local_50,&local_60);
  Catch::AssertionHandler::complete(&local_50);
  if (local_50.m_completed == false) {
    (*(local_50.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return;
}

Assistant:

void assertValuesInOrder(TVector& v, TArgs&&... args) {
    auto a = std::array{std::forward<TArgs>(args)...};
    CHECK(std::ranges::equal(v, a, {}, &Constructable::getValue));
}